

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

void line_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Style local_38;
  Am_Style ls;
  int y2;
  int x2;
  int y1;
  int x1;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar4 = Am_Object::Get(self,0x8b,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(self,0x8c,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(self,0x8d,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  ls.data._4_4_ = iVar3 + x_offset;
  pAVar4 = Am_Object::Get(self,0x8e,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  ls.data._0_4_ = iVar3 + y_offset;
  pAVar4 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&local_38,pAVar4);
  (*drawonable->_vptr_Am_Drawonable[0x28])
            (drawonable,&local_38,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
             (ulong)ls.data._4_4_,(ulong)(uint)ls.data,0);
  Am_Style::~Am_Style(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, line_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int x1 = (int)self.Get(Am_X1) + x_offset;
  int y1 = (int)self.Get(Am_Y1) + y_offset;
  int x2 = (int)self.Get(Am_X2) + x_offset;
  int y2 = (int)self.Get(Am_Y2) + y_offset;
  Am_Style ls = self.Get(Am_LINE_STYLE);
  drawonable->Draw_Line(ls, x1, y1, x2, y2);
}